

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void __thiscall
Assimp::PlyExporter::PlyExporter(PlyExporter *this,char *_filename,aiScene *pScene,bool binary)

{
  string *this_00;
  aiMesh *this_01;
  aiMaterial *pMat;
  bool bVar1;
  aiReturn aVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  uint n_1;
  int iVar6;
  uint uVar7;
  uint n;
  char *pcVar8;
  uint components;
  uint i;
  ulong uVar9;
  locale local_458 [12];
  int local_44c;
  string *local_448;
  locale local_440 [12];
  aiString s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  local_448 = &this->filename;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_448,_filename,(allocator<char> *)&s);
  this_00 = &this->endl;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"\n",(allocator<char> *)&s);
  std::locale::locale(local_458,"C");
  std::ios::imbue(local_440);
  std::locale::~locale(local_440);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  uVar7 = 4;
  components = 0;
  iVar6 = 0;
  for (uVar9 = 0; uVar9 < pScene->mNumMeshes; uVar9 = uVar9 + 1) {
    this_01 = pScene->mMeshes[uVar9];
    iVar6 = iVar6 + this_01->mNumFaces;
    components = components | (this_01->mNumVertices != 0 && this_01->mNormals != (aiVector3D *)0x0)
    ;
    bVar1 = aiMesh::HasTangentsAndBitangents(this_01);
    if (bVar1) {
      components = components | 2;
    }
    lVar5 = 0;
    while (((lVar5 != 8 && (this_01->mTextureCoords[lVar5] != (aiVector3D *)0x0)) &&
           (this_01->mNumVertices != 0))) {
      components = components | 4 << ((byte)lVar5 & 0x1f);
      lVar5 = lVar5 + 1;
    }
    lVar5 = 0;
    while (((lVar5 != 8 && (this_01->mColors[lVar5] != (aiColor4D *)0x0)) &&
           (this_01->mNumVertices != 0))) {
      components = components | 0x400 << ((byte)lVar5 & 0x1f);
      lVar5 = lVar5 + 1;
    }
  }
  poVar3 = std::operator<<((ostream *)this,"ply");
  std::operator<<(poVar3,(string *)this_00);
  pcVar8 = "format ascii 1.0";
  if (binary) {
    pcVar8 = "format binary_little_endian 1.0";
  }
  poVar3 = std::operator<<((ostream *)this,pcVar8);
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,
                           "comment Created by Open Asset Import Library - http://assimp.sf.net (v")
  ;
  aiGetVersionMajor();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'.');
  aiGetVersionMinor();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'.');
  aiGetVersionRevision();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)this_00);
  local_44c = iVar6;
  for (uVar9 = 0; uVar9 < pScene->mNumMaterials; uVar9 = uVar9 + 1) {
    pMat = pScene->mMaterials[uVar9];
    s.length = 0;
    s.data[0] = '\0';
    memset(s.data + 1,0x1b,0x3ff);
    aVar2 = aiGetMaterialString(pMat,"$tex.file",1,0,&s);
    if (aVar2 == aiReturn_SUCCESS) {
      poVar3 = std::operator<<((ostream *)this,"comment TextureFile ");
      poVar3 = std::operator<<(poVar3,s.data);
      std::operator<<(poVar3,(string *)this_00);
    }
  }
  poVar3 = std::operator<<((ostream *)this,"element vertex ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,"property ");
  poVar3 = std::operator<<(poVar3,"float");
  poVar3 = std::operator<<(poVar3," x");
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,"property ");
  poVar3 = std::operator<<(poVar3,"float");
  poVar3 = std::operator<<(poVar3," y");
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,"property ");
  poVar3 = std::operator<<(poVar3,"float");
  poVar3 = std::operator<<(poVar3," z");
  std::operator<<(poVar3,(string *)this_00);
  if ((components & 1) != 0) {
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," nx");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," ny");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," nz");
    std::operator<<(poVar3,(string *)this_00);
  }
  for (lVar5 = 0; ((uVar7 & components) != 0 && (lVar5 != 8)); lVar5 = lVar5 + 1) {
    if (lVar5 == 0) {
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"float");
      poVar3 = std::operator<<(poVar3," s");
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"float");
      poVar3 = std::operator<<(poVar3," t");
    }
    else {
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"float");
      poVar3 = std::operator<<(poVar3," s");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"float");
      poVar3 = std::operator<<(poVar3," t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    std::operator<<(poVar3,(string *)this_00);
    uVar7 = uVar7 * 2;
  }
  uVar7 = 0x400;
  for (lVar5 = 0; ((uVar7 & components) != 0 && (lVar5 != 8)); lVar5 = lVar5 + 1) {
    if (lVar5 == 0) {
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," red");
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," green");
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," blue");
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," alpha");
    }
    else {
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," red");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," green");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," blue");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,(string *)this_00);
      poVar3 = std::operator<<((ostream *)this,"property ");
      poVar3 = std::operator<<(poVar3,"uchar");
      poVar3 = std::operator<<(poVar3," alpha");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    std::operator<<(poVar3,(string *)this_00);
    uVar7 = uVar7 * 2;
  }
  if ((components & 2) != 0) {
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," tx");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," ty");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," tz");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," bx");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," by");
    std::operator<<(poVar3,(string *)this_00);
    poVar3 = std::operator<<((ostream *)this,"property ");
    poVar3 = std::operator<<(poVar3,"float");
    poVar3 = std::operator<<(poVar3," bz");
    std::operator<<(poVar3,(string *)this_00);
  }
  poVar3 = std::operator<<((ostream *)this,"element face ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,"property list uchar int vertex_index");
  std::operator<<(poVar3,(string *)this_00);
  poVar3 = std::operator<<((ostream *)this,"end_header");
  std::operator<<(poVar3,(string *)this_00);
  uVar9 = 0;
  while( true ) {
    uVar4 = (ulong)pScene->mNumMeshes;
    if (uVar4 <= uVar9) break;
    if (binary) {
      WriteMeshVertsBinary(this,pScene->mMeshes[uVar9],components);
    }
    else {
      WriteMeshVerts(this,pScene->mMeshes[uVar9],components);
    }
    uVar9 = uVar9 + 1;
  }
  uVar7 = 0;
  for (uVar9 = 0; uVar9 < uVar4; uVar9 = uVar9 + 1) {
    if (binary) {
      WriteMeshIndicesBinary_Generic<unsigned_char,int>(pScene->mMeshes[uVar9],uVar7,&this->mOutput)
      ;
    }
    else {
      WriteMeshIndices(this,pScene->mMeshes[uVar9],uVar7);
    }
    uVar7 = uVar7 + pScene->mMeshes[uVar9]->mNumVertices;
    uVar4 = (ulong)pScene->mNumMeshes;
  }
  std::locale::~locale(local_458);
  return;
}

Assistant:

PlyExporter::PlyExporter(const char* _filename, const aiScene* pScene, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    unsigned int faces = 0u, vertices = 0u, components = 0u;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        const aiMesh& m = *pScene->mMeshes[i];
        faces += m.mNumFaces;
        vertices += m.mNumVertices;

        if (m.HasNormals()) {
            components |= PLY_EXPORT_HAS_NORMALS;
        }
        if (m.HasTangentsAndBitangents()) {
            components |= PLY_EXPORT_HAS_TANGENTS_BITANGENTS;
        }
        for (unsigned int t = 0; m.HasTextureCoords(t); ++t) {
            components |= PLY_EXPORT_HAS_TEXCOORDS << t;
        }
        for (unsigned int t = 0; m.HasVertexColors(t); ++t) {
            components |= PLY_EXPORT_HAS_COLORS << t;
        }
    }

    mOutput << "ply" << endl;
    if (binary) {
#if (defined AI_BUILD_BIG_ENDIAN)
        mOutput << "format binary_big_endian 1.0" << endl;
#else
        mOutput << "format binary_little_endian 1.0" << endl;
#endif
    }
    else {
        mOutput << "format ascii 1.0" << endl;
    }
    mOutput << "comment Created by Open Asset Import Library - http://assimp.sf.net (v"
        << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl;

    // Look through materials for a diffuse texture, and add it if found
    for ( unsigned int i = 0; i < pScene->mNumMaterials; ++i )
    {
        const aiMaterial* const mat = pScene->mMaterials[i];
        aiString s;
        if ( AI_SUCCESS == mat->Get( AI_MATKEY_TEXTURE_DIFFUSE( 0 ), s ) )
        {
            mOutput << "comment TextureFile " << s.data << endl;
        }
    }

    // TODO: probably want to check here rather than just assume something
    //       definitely not good to always write float even if we might have double precision

    ai_real tmp = 0.0;
    const char * typeName = type_of(tmp);

    mOutput << "element vertex " << vertices << endl;
    mOutput << "property " << typeName << " x" << endl;
    mOutput << "property " << typeName << " y" << endl;
    mOutput << "property " << typeName << " z" << endl;

    if(components & PLY_EXPORT_HAS_NORMALS) {
        mOutput << "property " << typeName << " nx" << endl;
        mOutput << "property " << typeName << " ny" << endl;
        mOutput << "property " << typeName << " nz" << endl;
    }

    // write texcoords first, just in case an importer does not support tangents
    // bitangents and just skips over the rest of the line upon encountering
    // unknown fields (Ply leaves pretty much every vertex component open,
    // but in reality most importers only know about vertex positions, normals
    // and texture coordinates).
    for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << typeName << " s" << endl;
            mOutput << "property " << typeName << " t" << endl;
        }
        else {
            mOutput << "property " << typeName << " s" << c << endl;
            mOutput << "property " << typeName << " t" << c << endl;
        }
    }

    for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
        if (!c) {
            mOutput << "property " << "uchar" << " red" << endl;
            mOutput << "property " << "uchar" << " green" << endl;
            mOutput << "property " << "uchar" << " blue" << endl;
            mOutput << "property " << "uchar" << " alpha" << endl;
        }
        else {
            mOutput << "property " << "uchar" << " red" << c << endl;
            mOutput << "property " << "uchar" << " green" << c << endl;
            mOutput << "property " << "uchar" << " blue" << c << endl;
            mOutput << "property " << "uchar" << " alpha" << c << endl;
        }
    }

    if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
        mOutput << "property " << typeName << " tx" << endl;
        mOutput << "property " << typeName << " ty" << endl;
        mOutput << "property " << typeName << " tz" << endl;
        mOutput << "property " << typeName << " bx" << endl;
        mOutput << "property " << typeName << " by" << endl;
        mOutput << "property " << typeName << " bz" << endl;
    }

    mOutput << "element face " << faces << endl;

    // uchar seems to be the most common type for the number of indices per polygon and int seems to be most common for the vertex indices.
    // For instance, MeshLab fails to load meshes in which both types are uint. Houdini seems to have problems as well.
    // Obviously, using uchar will not work for meshes with polygons with more than 255 indices, but how realistic is this case?
    mOutput << "property list uchar int vertex_index" << endl;

    mOutput << "end_header" << endl;

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshVertsBinary(pScene->mMeshes[i], components);
        }
        else {
            WriteMeshVerts(pScene->mMeshes[i], components);
        }
    }
    for (unsigned int i = 0, ofs = 0; i < pScene->mNumMeshes; ++i) {
        if (binary) {
            WriteMeshIndicesBinary(pScene->mMeshes[i], ofs);
        }
        else {
            WriteMeshIndices(pScene->mMeshes[i], ofs);
        }
        ofs += pScene->mMeshes[i]->mNumVertices;
    }
}